

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_inline_table<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  char cVar2;
  element_type *peVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer pcVar6;
  value_type pbVar7;
  byte bVar8;
  size_type sVar9;
  undefined1 uVar10;
  size_t sVar11;
  value_type *pvVar12;
  error_type *peVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  value_type *ppbVar15;
  error_type *peVar16;
  error_type *peVar17;
  value_type *pvVar18;
  ulong uVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  basic_value<toml::type_config> *v;
  bool bVar21;
  long lVar22;
  EVP_PKEY_CTX *ctx_00;
  undefined **__args;
  basic_value<toml::type_config> *ctx_01;
  size_t sVar23;
  _Alloc_hider _Var24;
  ulong uVar25;
  error_info *ctx_02;
  ulong uVar26;
  bool bVar27;
  table_format_info fmt;
  optional<toml::detail::multiline_spacer<toml::type_config>_> spacer;
  type val;
  basic_value<toml::type_config> retval;
  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
  com_res;
  location first;
  result<toml::basic_value<toml::type_config>_*,_toml::error_info> ins_res;
  table_type table;
  ulong local_d18;
  long local_d10;
  undefined1 local_d08 [32];
  bool local_ce8;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *local_ce0;
  error_info *local_cd8;
  ulong local_cd0;
  vector<toml::error_info,_std::allocator<toml::error_info>_> *local_cc8;
  _func_int **local_cc0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_cb8;
  comment_type *local_cb0;
  error_info local_ca8;
  error_info local_c50;
  undefined1 local_bf8 [56];
  _Alloc_hider local_bc0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bb0;
  undefined1 local_ba0 [16];
  undefined1 local_b90 [56];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b58 [6];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_af0;
  string local_ad8;
  string local_ab8;
  string local_a98;
  string local_a78;
  string local_a58;
  string local_a38;
  string local_a18;
  string local_9f8;
  undefined1 local_9d8 [8];
  undefined1 auStack_9d0 [16];
  undefined1 auStack_9c0 [40];
  undefined1 local_998 [8];
  region local_990;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_928 [6];
  undefined1 local_888 [16];
  pointer local_878;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_868;
  undefined1 local_850 [32];
  char local_830;
  region local_828;
  undefined1 local_7c0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7a0 [4];
  location local_758;
  result<toml::basic_value<toml::type_config>_*,_toml::error_info> local_710;
  undefined1 local_6b0 [32];
  float local_690;
  undefined1 local_688 [16];
  region local_678;
  undefined1 local_610 [16];
  _Alloc_hider local_600;
  char local_5f0 [16];
  size_t local_5e0;
  size_t local_5d8;
  size_t sStack_5d0;
  size_t local_5c8;
  size_t local_5c0;
  size_t sStack_5b8;
  size_t local_5b0;
  source_location local_5a8;
  source_location local_528;
  source_location local_4a8;
  source_location local_428;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_3b0;
  basic_value<toml::type_config> local_378;
  basic_value<toml::type_config> local_2b0;
  failure<toml::error_info> local_1e8;
  failure<toml::error_info> local_190;
  failure<toml::error_info> local_138;
  failure<toml::error_info> local_e0;
  failure<toml::error_info> local_88;
  
  uVar25 = (long)(ctx->errors_).
                 super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(ctx->errors_).
                 super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_cd8 = (error_info *)ctx;
  location::location(&local_758,loc);
  ctx_02 = local_cd8;
  peVar3 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar26 = loc->location_;
  lVar22 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  uVar19 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_finish - lVar22;
  if ((uVar26 < uVar19) && (*(char *)(lVar22 + uVar26) == '{')) {
    if (uVar26 + 1 < uVar19) {
      if (*(char *)(lVar22 + uVar26) == '\n') {
        loc->line_number_ = loc->line_number_ + 1;
        sVar11 = 1;
      }
      else {
        sVar11 = loc->column_number_ + 1;
      }
      loc->column_number_ = sVar11;
      uVar19 = uVar26 + 1;
    }
    else if (uVar19 != uVar26) {
      sVar11 = loc->line_number_;
      sVar23 = loc->column_number_;
      do {
        if (*(char *)(lVar22 + uVar26) == '\n') {
          sVar11 = sVar11 + 1;
          loc->line_number_ = sVar11;
          sVar23 = 1;
        }
        else {
          sVar23 = sVar23 + 1;
        }
        loc->column_number_ = sVar23;
        uVar26 = uVar26 + 1;
      } while (uVar19 != uVar26);
    }
    loc->location_ = uVar19;
    local_6b0._0_8_ = local_688 + 8;
    local_6b0._8_8_ = 1;
    local_6b0._16_16_ = (undefined1  [16])0x0;
    local_690 = 1.0;
    local_688 = (undefined1  [16])0x0;
    local_ce8 = false;
    local_ce0 = __return_storage_ptr__;
    local_cd0 = uVar25;
    if (*(char *)((long)&(local_cd8->title_)._M_string_length + 5) == '\x01') {
      skip_multiline_spacer<toml::type_config>
                ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)local_9d8,loc,
                 (context<toml::type_config> *)local_cd8,false);
      std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::
      _M_move_assign((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_> *)
                     local_d08,
                     (_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_> *)
                     local_9d8);
      if ((bool)auStack_9c0[8] == true) {
        auStack_9c0[8] = false;
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)auStack_9d0);
      }
      local_d18 = 0x201;
      ctx_02 = local_cd8;
      if (local_ce8 == true) {
        local_d18 = (ulong)(byte)local_d08[0] * 2 + 0x201;
      }
    }
    else {
      local_d18 = 0x201;
      skip_whitespace<toml::type_config>(loc,(context<toml::type_config> *)local_cd8);
    }
    local_cc8 = (vector<toml::error_info,_std::allocator<toml::error_info>_> *)
                ((long)&(ctx_02->title_).field_2 + 8);
    local_cb0 = &local_378.comments_;
    local_cc0 = (_func_int **)&PTR__scanner_base_004df828;
    local_cb8 = &vStack_af0;
    bVar8 = 1;
    bVar27 = false;
    while( true ) {
      peVar3 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      lVar22 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - lVar22) <= loc->location_)
      break;
      if (*(char *)(lVar22 + loc->location_) == '}') {
        if ((bVar27) && (*(char *)((long)&(ctx_02->title_)._M_string_length + 6) == '\0')) {
          region::region((region *)local_ba0,loc);
          __return_storage_ptr__ = local_ce0;
          source_location::source_location((source_location *)local_9d8,(region *)local_ba0);
          region::~region((region *)local_ba0);
          local_a38._M_dataplus._M_p = (pointer)&local_a38.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a38,
                     "toml::parse_inline_table: trailing comma is not allowed in TOML-v1.0.0)","");
          p_Var1 = &local_990.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount;
          local_4a8.last_line_ = CONCAT71(auStack_9c0._9_7_,auStack_9c0[8]);
          local_4a8.file_name_._M_dataplus._M_p = (pointer)&local_4a8.file_name_.field_2;
          local_4a8.last_offset_._0_4_ = auStack_9c0._24_4_;
          local_4a8.last_offset_._4_4_ = auStack_9c0._28_4_;
          local_4a8.length_._0_4_ = auStack_9c0._32_4_;
          local_4a8.length_._4_4_ = auStack_9c0._36_4_;
          local_4a8.last_column_ = auStack_9c0._16_8_;
          local_4a8.first_column_ = auStack_9d0._8_8_;
          local_4a8.first_offset_ = auStack_9c0._0_8_;
          local_4a8.first_line_ = auStack_9d0._0_8_;
          if (local_998 == (undefined1  [8])p_Var1) {
            local_4a8.file_name_.field_2._8_8_ = local_990.source_name_._M_dataplus._M_p;
          }
          else {
            local_4a8.file_name_._M_dataplus._M_p = (pointer)local_998;
          }
          local_4a8.file_name_._M_string_length =
               (size_type)
               local_990.source_.
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          local_990.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_990.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._0_1_ = '\0';
          local_4a8.line_str_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)local_990.source_name_._M_string_length;
          local_4a8.line_str_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)local_990.source_name_.field_2._M_allocated_capacity;
          local_4a8.line_str_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_990.source_name_.field_2._8_8_;
          local_990.source_name_._8_16_ = (undefined1  [16])0x0;
          local_990.source_name_.field_2._8_8_ = (pointer)0x0;
          local_a58._M_dataplus._M_p = (pointer)&local_a58.field_2;
          local_998 = (undefined1  [8])p_Var1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a58,"here","");
          make_error_info<>((error_info *)local_ba0,&local_a38,&local_4a8,&local_a58);
          err<toml::error_info>(&local_e0,(error_info *)local_ba0);
          __return_storage_ptr__->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_e0
                    );
          failure<toml::error_info>::~failure(&local_e0);
          error_info::~error_info((error_info *)local_ba0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
            operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
          }
          source_location::~source_location(&local_4a8);
          _Var24._M_p = local_a38._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a38._M_dataplus._M_p != &local_a38.field_2) goto LAB_0037b8a6;
          goto LAB_0037b8ae;
        }
        if (*(char *)((long)&(ctx_02->title_)._M_string_length + 5) == '\x01') {
          if (((local_ce8 == true) && ((bool)local_d08[0] == true)) && (local_d08[1] != none)) {
            local_d18 = local_d18 & 0xffffffffffff00ff | (ulong)(byte)local_d08[1] << 8;
            local_d10 = (ulong)(uint)local_d08._4_4_ << 0x20;
          }
          else {
            local_d10 = 0;
          }
          goto LAB_0037b033;
        }
        break;
      }
      if (!(bool)(bVar8 | bVar27)) {
        region::region((region *)local_ba0,loc);
        source_location::source_location((source_location *)local_9d8,(region *)local_ba0);
        __return_storage_ptr__ = local_ce0;
        region::~region((region *)local_ba0);
        local_a78._M_dataplus._M_p = (pointer)&local_a78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a78,
                   "toml::parse_inline_table: expected value-separator `,` or closing `}`","");
        p_Var1 = &local_990.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount;
        local_528.last_line_ = CONCAT71(auStack_9c0._9_7_,auStack_9c0[8]);
        local_528.file_name_._M_dataplus._M_p = (pointer)&local_528.file_name_.field_2;
        local_528.last_offset_._0_4_ = auStack_9c0._24_4_;
        local_528.last_offset_._4_4_ = auStack_9c0._28_4_;
        local_528.length_._0_4_ = auStack_9c0._32_4_;
        local_528.length_._4_4_ = auStack_9c0._36_4_;
        local_528.last_column_ = auStack_9c0._16_8_;
        local_528.first_column_ = auStack_9d0._8_8_;
        local_528.first_offset_ = auStack_9c0._0_8_;
        local_528.first_line_ = auStack_9d0._0_8_;
        if (local_998 == (undefined1  [8])p_Var1) {
          local_528.file_name_.field_2._8_8_ = local_990.source_name_._M_dataplus._M_p;
        }
        else {
          local_528.file_name_._M_dataplus._M_p = (pointer)local_998;
        }
        local_528.file_name_._M_string_length =
             (size_type)
             local_990.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        local_990.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_990.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi._0_1_ = '\0';
        local_528.line_str_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_990.source_name_._M_string_length
        ;
        local_528.line_str_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)local_990.source_name_.field_2._M_allocated_capacity;
        local_528.line_str_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_990.source_name_.field_2._8_8_;
        local_990.source_name_._8_16_ = ZEXT816(0);
        local_990.source_name_.field_2._8_8_ = (pointer)0x0;
        local_a98._M_dataplus._M_p = (pointer)&local_a98.field_2;
        local_998 = (undefined1  [8])p_Var1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a98,"here","");
        make_error_info<>((error_info *)local_ba0,&local_a78,&local_528,&local_a98);
        err<toml::error_info>(&local_138,(error_info *)local_ba0);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_138)
        ;
        failure<toml::error_info>::~failure(&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b90._40_8_ != local_b58) {
          operator_delete((void *)local_b90._40_8_,local_b58[0]._M_allocated_capacity + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_b90 + 0x10));
        if ((element_type *)local_ba0._0_8_ != (element_type *)local_b90) {
          operator_delete((void *)local_ba0._0_8_,(ulong)(local_b90._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a98._M_dataplus._M_p != &local_a98.field_2) {
          operator_delete(local_a98._M_dataplus._M_p,local_a98.field_2._M_allocated_capacity + 1);
        }
        source_location::~source_location(&local_528);
        local_a38.field_2._M_allocated_capacity = local_a78.field_2._M_allocated_capacity;
        _Var24._M_p = local_a78._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a78._M_dataplus._M_p != &local_a78.field_2) goto LAB_0037b8a6;
        goto LAB_0037b8ae;
      }
      if (((local_ce8 == true) && ((bool)local_d08[0] == true)) && (local_d08[1] != none)) {
        local_d18 = (ulong)((uint)local_d18 & 0xffff00ff) | (ulong)(byte)local_d08[1] << 8 |
                    (ulong)(uint)local_d08._4_4_ << 0x20;
      }
      parse_key_value_pair<toml::type_config>
                ((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                  *)local_9d8,loc,(context<toml::type_config> *)ctx_02);
      uVar10 = local_9d8[0];
      if ((bool)local_9d8[0] == true) {
        pvVar12 = result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                  ::unwrap((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                            *)local_9d8,(source_location)0x4e0408);
        local_868.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pvVar12->first).first.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_868.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pvVar12->first).first.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_868.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pvVar12->first).first.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pvVar12->first).first.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar12->first).first.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar12->first).first.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvVar12 = result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                  ::unwrap((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                            *)local_9d8,(source_location)0x4e0420);
        local_828.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (pvVar12->first).second.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        local_828.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             (pvVar12->first).second.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        (pvVar12->first).second.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (pvVar12->first).second.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_828.source_name_._M_dataplus._M_p = (pointer)&local_828.source_name_.field_2;
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pvVar12->first).second.source_name_._M_dataplus._M_p;
        paVar20 = &(pvVar12->first).second.source_name_.field_2;
        if (paVar4 == paVar20) {
          local_828.source_name_.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_828.source_name_.field_2._8_8_ =
               *(undefined8 *)((long)&(pvVar12->first).second.source_name_.field_2 + 8);
        }
        else {
          local_828.source_name_.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_828.source_name_._M_dataplus._M_p = (pointer)paVar4;
        }
        local_828.source_name_._M_string_length =
             (pvVar12->first).second.source_name_._M_string_length;
        (pvVar12->first).second.source_name_._M_dataplus._M_p = (pointer)paVar20;
        (pvVar12->first).second.source_name_._M_string_length = 0;
        (pvVar12->first).second.source_name_.field_2._M_local_buf[0] = '\0';
        local_828.last_column_ = (pvVar12->first).second.last_column_;
        local_828.length_ = (pvVar12->first).second.length_;
        local_828.first_ = (pvVar12->first).second.first_;
        local_828.first_line_ = (pvVar12->first).second.first_line_;
        local_828.first_column_ = (pvVar12->first).second.first_column_;
        local_828.last_ = (pvVar12->first).second.last_;
        local_828.last_line_ = (pvVar12->first).second.last_line_;
        pvVar12 = result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                  ::unwrap((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                            *)local_9d8,(source_location)0x4e0438);
        basic_value<toml::type_config>::basic_value
                  ((basic_value<toml::type_config> *)local_ba0,&pvVar12->second);
        local_678.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = local_828.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        local_678.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             local_828.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        local_828.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_828.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_678.source_name_._M_dataplus._M_p = (pointer)&local_678.source_name_.field_2;
        paVar4 = &local_828.source_name_.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_828.source_name_._M_dataplus._M_p == paVar4) {
          local_678.source_name_.field_2._8_8_ = local_828.source_name_.field_2._8_8_;
        }
        else {
          local_678.source_name_._M_dataplus._M_p = local_828.source_name_._M_dataplus._M_p;
        }
        local_678.source_name_.field_2._M_allocated_capacity =
             local_828.source_name_.field_2._M_allocated_capacity;
        local_678.source_name_._M_string_length = local_828.source_name_._M_string_length;
        local_828.source_name_._M_string_length = 0;
        local_828.source_name_.field_2._M_allocated_capacity =
             local_828.source_name_.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_678.last_column_ = local_828.last_column_;
        local_678.last_ = local_828.last_;
        local_678.last_line_ = local_828.last_line_;
        local_678.first_line_ = local_828.first_line_;
        local_678.first_column_ = local_828.first_column_;
        local_678.length_ = local_828.length_;
        local_678.first_ = local_828.first_;
        local_828.source_name_._M_dataplus._M_p = (pointer)paVar4;
        basic_value<toml::type_config>::basic_value
                  (&local_378,(basic_value<toml::type_config> *)local_ba0);
        ctx_00 = (EVP_PKEY_CTX *)0x2;
        insert_value<toml::type_config>
                  (&local_710,dotted_keys,(table_type *)local_6b0,&local_868,&local_678,&local_378);
        basic_value<toml::type_config>::cleanup(&local_378,ctx_00);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_cb0);
        region::~region(&local_378.region_);
        region::~region(&local_678);
        if (local_710.is_ok_ == false) {
          peVar16 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap_err
                              (&local_710,(source_location)0x4e0450);
          local_c50.title_._M_dataplus._M_p = (pointer)&local_c50.title_.field_2;
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(peVar16->title_)._M_dataplus._M_p;
          paVar5 = &(peVar16->title_).field_2;
          if (paVar14 == paVar5) {
            local_c50.title_.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
            local_c50.title_.field_2._8_8_ = *(undefined8 *)((long)&(peVar16->title_).field_2 + 8);
          }
          else {
            local_c50.title_.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
            local_c50.title_._M_dataplus._M_p = (pointer)paVar14;
          }
          local_c50.title_._M_string_length = (peVar16->title_)._M_string_length;
          (peVar16->title_)._M_dataplus._M_p = (pointer)paVar5;
          (peVar16->title_)._M_string_length = 0;
          (peVar16->title_).field_2._M_local_buf[0] = '\0';
          local_c50.locations_.
          super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (peVar16->locations_).
               super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_c50.locations_.
          super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (peVar16->locations_).
               super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_c50.locations_.
          super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (peVar16->locations_).
               super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (peVar16->locations_).
          super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (peVar16->locations_).
          super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (peVar16->locations_).
          super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_c50.suffix_._M_dataplus._M_p = (pointer)&local_c50.suffix_.field_2;
          paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(peVar16->suffix_)._M_dataplus._M_p;
          paVar14 = &(peVar16->suffix_).field_2;
          if (paVar5 == paVar14) {
            local_c50.suffix_.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_c50.suffix_.field_2._8_8_ = *(undefined8 *)((long)&(peVar16->suffix_).field_2 + 8)
            ;
          }
          else {
            local_c50.suffix_.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_c50.suffix_._M_dataplus._M_p = (pointer)paVar5;
          }
          local_c50.suffix_._M_string_length = (peVar16->suffix_)._M_string_length;
          (peVar16->suffix_)._M_dataplus._M_p = (pointer)paVar14;
          (peVar16->suffix_)._M_string_length = 0;
          (peVar16->suffix_).field_2._M_local_buf[0] = '\0';
          std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
          emplace_back<toml::error_info>(local_cc8,&local_c50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c50.suffix_._M_dataplus._M_p != &local_c50.suffix_.field_2) {
            operator_delete(local_c50.suffix_._M_dataplus._M_p,
                            local_c50.suffix_.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&local_c50.locations_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c50.title_._M_dataplus._M_p != &local_c50.title_.field_2) {
            operator_delete(local_c50.title_._M_dataplus._M_p,
                            local_c50.title_.field_2._M_allocated_capacity + 1);
          }
          peVar3 = (loc->source_).
                   super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          sVar11 = loc->location_;
          lVar22 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                         ._M_impl.super__Vector_impl_data._M_start;
          uVar26 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                         ._M_impl.super__Vector_impl_data._M_finish - lVar22;
          __args = (undefined **)loc->column_number_;
          sVar23 = loc->line_number_;
          do {
            if (uVar26 <= sVar11) break;
            cVar2 = *(char *)(lVar22 + sVar11);
            if (((cVar2 == '\n') || (cVar2 == '}')) || (cVar2 == ',')) {
              bVar27 = cVar2 == ',';
              bVar21 = false;
            }
            else {
              if (sVar11 + 1 < uVar26) {
                if (*(char *)(lVar22 + sVar11) == '\n') {
                  sVar23 = sVar23 + 1;
                  loc->line_number_ = sVar23;
                  __args = (undefined **)0x1;
                }
                else {
                  __args = (undefined **)
                           ((long)&(((error_info *)__args)->title_)._M_dataplus._M_p + 1);
                }
                loc->column_number_ = (size_t)__args;
                uVar19 = sVar11 + 1;
              }
              else {
                for (; uVar19 = uVar26, uVar26 != sVar11; sVar11 = sVar11 + 1) {
                  if (*(char *)(lVar22 + sVar11) == '\n') {
                    sVar23 = sVar23 + 1;
                    loc->line_number_ = sVar23;
                    __args = (undefined **)0x1;
                  }
                  else {
                    __args = (undefined **)
                             ((long)&(((error_info *)__args)->title_)._M_dataplus._M_p + 1);
                  }
                  loc->column_number_ = (size_t)__args;
                }
              }
              sVar11 = uVar19;
              loc->location_ = sVar11;
              bVar21 = true;
            }
          } while (bVar21);
        }
        else {
          if (*(char *)((long)&(ctx_02->title_)._M_string_length + 5) == '\x01') {
            if (local_ce8 == true) {
              lVar22 = 0;
              uVar26 = 0;
              while (uVar26 < (ulong)((long)(local_d08._16_8_ - local_d08._8_8_) >> 5)) {
                ppbVar15 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap
                                     (&local_710,(source_location)0x4e0468);
                if (local_ce8 != true) goto LAB_0037ba65;
                if ((ulong)((long)(local_d08._16_8_ - local_d08._8_8_) >> 5) <= uVar26) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar26);
                }
                CLI::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&(*ppbVar15)->comments_,
                            (value_type *)((long)&((_Alloc_hider *)local_d08._8_8_)->_M_p + lVar22))
                ;
                uVar26 = uVar26 + 1;
                lVar22 = lVar22 + 0x20;
                if (local_ce8 == false) {
LAB_0037ba65:
                  std::__throw_bad_optional_access();
                }
              }
            }
            skip_multiline_spacer<toml::type_config>
                      ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)local_7c0,loc
                       ,(context<toml::type_config> *)ctx_02,false);
            std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::
            _M_move_assign((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                            *)local_d08,
                           (_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                            *)local_7c0);
            if ((bool)local_7a0[0]._0_1_ == true) {
              local_7a0[0]._M_local_buf[0] = false;
              CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_7c0 + 8));
            }
            if (local_ce8 == true) {
              lVar22 = 0;
              uVar26 = 0;
              while (uVar26 < (ulong)((long)(local_d08._16_8_ - local_d08._8_8_) >> 5)) {
                ppbVar15 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap
                                     (&local_710,(source_location)0x4e0480);
                if (local_ce8 != true) goto LAB_0037ba6a;
                if ((ulong)((long)(local_d08._16_8_ - local_d08._8_8_) >> 5) <= uVar26) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar26);
                }
                CLI::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&(*ppbVar15)->comments_,
                            (value_type *)((long)&((_Alloc_hider *)local_d08._8_8_)->_M_p + lVar22))
                ;
                uVar26 = uVar26 + 1;
                lVar22 = lVar22 + 0x20;
                if (local_ce8 == false) {
LAB_0037ba6a:
                  std::__throw_bad_optional_access();
                }
              }
              if (((bool)local_d08[0] == true) &&
                 (local_d18 = local_d18 & 0xffffffffffffff00 | 3, local_d08[1] != none)) {
                local_d18 = (ulong)((uint)local_d18 & 0xffff0003) | (ulong)(byte)local_d08[1] << 8 |
                            (ulong)(uint)local_d08._4_4_ << 0x20;
              }
            }
          }
          else {
            skip_whitespace<toml::type_config>(loc,(context<toml::type_config> *)ctx_02);
          }
          local_850._0_8_ = local_cc0;
          local_850[8] = ',';
          character::scan((region *)local_7c0,(character *)local_850,loc);
          lVar22 = CONCAT71(local_7c0._1_7_,local_7c0[0]);
          bVar27 = lVar22 != 0;
          region::~region((region *)local_7c0);
          ctx_02 = local_cd8;
          if (*(char *)((long)&(local_cd8->title_)._M_string_length + 5) == '\x01') {
            __args = (undefined **)loc;
            parse_comment_line<toml::type_config>
                      ((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                        *)local_7c0,loc,(context<toml::type_config> *)local_cd8);
            if ((bool)local_7c0[0] == false) {
              peVar17 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                        ::unwrap_err((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                      *)local_7c0,(source_location)0x4e0498);
              local_bf8._0_8_ = local_bf8 + 0x10;
              pcVar6 = (peVar17->title_)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_bf8,pcVar6,pcVar6 + (peVar17->title_)._M_string_length);
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(local_bf8 + 0x20),&peVar17->locations_);
              local_bc0._M_p = (pointer)&local_bb0;
              pcVar6 = (peVar17->suffix_)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_bc0,pcVar6,pcVar6 + (peVar17->suffix_)._M_string_length);
              __args = (undefined **)local_bf8;
              std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
              emplace_back<toml::error_info>(local_cc8,(error_info *)__args);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_bc0._M_p != &local_bb0) {
                __args = (undefined **)(local_bb0._M_allocated_capacity + 1);
                operator_delete(local_bc0._M_p,(ulong)__args);
              }
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_bf8 + 0x20));
              if ((undefined1 *)local_bf8._0_8_ != local_bf8 + 0x10) {
                __args = (undefined **)(local_bf8._16_8_ + 1);
                operator_delete((void *)local_bf8._0_8_,(ulong)__args);
              }
            }
            if ((bool)local_7c0[0] == true) {
              __args = &PTR_s__workspace_llm4binary_github_lic_004e04b0;
              pvVar18 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                        ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                  *)local_7c0,(source_location)0x4e04b0);
              bVar21 = (pvVar18->
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       )._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_engaged;
            }
            else {
              bVar21 = false;
            }
            if (bVar21 != false) {
              ppbVar15 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap
                                   (&local_710,(source_location)0x4e04c8);
              pbVar7 = *ppbVar15;
              __args = (undefined **)
                       result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                       ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                 *)local_7c0,(source_location)0x4e04e0);
              if (*(char *)&(((error_info *)__args)->locations_).
                            super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start == '\0') {
                std::__throw_bad_optional_access();
              }
              CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&pbVar7->comments_,(value_type *)__args);
              local_d18 = local_d18 & 0xffffffffffffff00 | 3;
            }
            ctx_02 = local_cd8;
            if (lVar22 != 0) {
              __args = (undefined **)local_850;
              skip_multiline_spacer<toml::type_config>
                        ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)__args,loc,
                         (context<toml::type_config> *)local_cd8,bVar21);
              std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::
              _M_move_assign((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                              *)local_d08,
                             (_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                              *)__args);
              if (local_830 == '\x01') {
                local_830 = '\0';
                CLI::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_850 + 8));
              }
              if ((local_ce8 == true) && ((bool)local_d08[0] == true)) {
                local_d18 = local_d18 & 0xffffffffffffff00 | 3;
              }
            }
            result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
            ::cleanup((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                       *)local_7c0,(EVP_PKEY_CTX *)__args);
          }
          else {
            __args = (undefined **)local_cd8;
            skip_whitespace<toml::type_config>(loc,(context<toml::type_config> *)local_cd8);
          }
        }
        if (local_710.is_ok_ == false) {
          failure<toml::error_info>::~failure((failure<toml::error_info> *)&local_710.field_1.succ_)
          ;
        }
        basic_value<toml::type_config>::cleanup
                  ((basic_value<toml::type_config> *)local_ba0,(EVP_PKEY_CTX *)__args);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_cb8);
        region::~region((region *)local_b58);
        region::~region(&local_828);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_868);
      }
      else {
        peVar13 = result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                  ::unwrap_err((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                                *)local_9d8,(source_location)0x4e04f8);
        local_ca8.title_._M_dataplus._M_p = (pointer)&local_ca8.title_.field_2;
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(peVar13->title_)._M_dataplus._M_p;
        paVar5 = &(peVar13->title_).field_2;
        if (paVar14 == paVar5) {
          local_ca8.title_.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_ca8.title_.field_2._8_8_ = *(undefined8 *)((long)&(peVar13->title_).field_2 + 8);
        }
        else {
          local_ca8.title_.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
          local_ca8.title_._M_dataplus._M_p = (pointer)paVar14;
        }
        local_ca8.title_._M_string_length = (peVar13->title_)._M_string_length;
        (peVar13->title_)._M_dataplus._M_p = (pointer)paVar5;
        (peVar13->title_)._M_string_length = 0;
        (peVar13->title_).field_2._M_local_buf[0] = '\0';
        local_ca8.locations_.
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (peVar13->locations_).
             super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_ca8.locations_.
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (peVar13->locations_).
             super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_ca8.locations_.
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (peVar13->locations_).
             super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (peVar13->locations_).
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (peVar13->locations_).
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (peVar13->locations_).
        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_ca8.suffix_._M_dataplus._M_p = (pointer)&local_ca8.suffix_.field_2;
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(peVar13->suffix_)._M_dataplus._M_p;
        paVar14 = &(peVar13->suffix_).field_2;
        if (paVar5 == paVar14) {
          local_ca8.suffix_.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_ca8.suffix_.field_2._8_8_ = *(undefined8 *)((long)&(peVar13->suffix_).field_2 + 8);
        }
        else {
          local_ca8.suffix_.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_ca8.suffix_._M_dataplus._M_p = (pointer)paVar5;
        }
        local_ca8.suffix_._M_string_length = (peVar13->suffix_)._M_string_length;
        (peVar13->suffix_)._M_dataplus._M_p = (pointer)paVar14;
        (peVar13->suffix_)._M_string_length = 0;
        (peVar13->suffix_).field_2._M_local_buf[0] = '\0';
        std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
        emplace_back<toml::error_info>(local_cc8,&local_ca8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ca8.suffix_._M_dataplus._M_p != &local_ca8.suffix_.field_2) {
          operator_delete(local_ca8.suffix_._M_dataplus._M_p,
                          local_ca8.suffix_.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_ca8.locations_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ca8.title_._M_dataplus._M_p != &local_ca8.title_.field_2) {
          operator_delete(local_ca8.title_._M_dataplus._M_p,
                          local_ca8.title_.field_2._M_allocated_capacity + 1);
        }
        peVar3 = (loc->source_).
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        uVar26 = loc->location_;
        lVar22 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start;
        uVar19 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish - lVar22;
        if (uVar26 < uVar19) {
          sVar9 = (ctx_02->title_)._M_string_length;
          sVar11 = loc->line_number_;
          sVar23 = loc->column_number_;
          do {
            if ((*(char *)(lVar22 + uVar26) == '}') ||
               (((uVar26 < uVar19 && ((sVar9 & 0x10000000000) == 0)) &&
                (*(char *)(lVar22 + uVar26) == '\n')))) break;
            if (uVar26 + 1 < uVar19) {
              if (*(char *)(lVar22 + uVar26) == '\n') {
                sVar11 = sVar11 + 1;
                loc->line_number_ = sVar11;
                sVar23 = 1;
              }
              else {
                sVar23 = sVar23 + 1;
              }
              loc->column_number_ = sVar23;
              uVar25 = uVar26 + 1;
            }
            else {
              for (; uVar25 = uVar19, uVar19 != uVar26; uVar26 = uVar26 + 1) {
                if (*(char *)(lVar22 + uVar26) == '\n') {
                  sVar11 = sVar11 + 1;
                  loc->line_number_ = sVar11;
                  sVar23 = 1;
                }
                else {
                  sVar23 = sVar23 + 1;
                }
                loc->column_number_ = sVar23;
              }
            }
            uVar26 = uVar25;
            loc->location_ = uVar26;
          } while (uVar26 < uVar19);
        }
      }
      if ((bool)local_9d8[0] == true) {
        success<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>_>
        ::~success((success<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>_>
                    *)auStack_9d0);
      }
      else {
        failure<toml::error_info>::~failure((failure<toml::error_info> *)auStack_9d0);
      }
      bVar8 = 0;
      if ((bool)uVar10 == false) break;
    }
    local_d10 = 0;
LAB_0037b033:
    __return_storage_ptr__ = local_ce0;
    peVar3 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar26 = loc->location_;
    lVar22 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
    uVar19 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish - lVar22;
    if ((uVar26 < uVar19) && (*(char *)(lVar22 + uVar26) == '}')) {
      if (uVar26 + 1 < uVar19) {
        if (*(char *)(lVar22 + uVar26) == '\n') {
          loc->line_number_ = loc->line_number_ + 1;
          sVar11 = 1;
        }
        else {
          sVar11 = loc->column_number_ + 1;
        }
        loc->column_number_ = sVar11;
        uVar19 = uVar26 + 1;
      }
      else if (uVar19 != uVar26) {
        sVar11 = loc->line_number_;
        sVar23 = loc->column_number_;
        do {
          if (*(char *)(lVar22 + uVar26) == '\n') {
            sVar11 = sVar11 + 1;
            loc->line_number_ = sVar11;
            sVar23 = 1;
          }
          else {
            sVar23 = sVar23 + 1;
          }
          loc->column_number_ = sVar23;
          uVar26 = uVar26 + 1;
        } while (uVar19 != uVar26);
      }
      loc->location_ = uVar19;
      if (local_cd0 <
          (ulong)((long)(ctx_02->locations_).
                        super__Vector_base<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start -
                 *(long *)((long)&(ctx_02->title_).field_2 + 8))) {
        context<toml::type_config>::pop_last_error
                  ((error_info *)local_9d8,(context<toml::type_config> *)ctx_02);
        err<toml::error_info>(&local_1e8,(error_info *)local_9d8);
        __return_storage_ptr__->is_ok_ = false;
        failure<toml::error_info>::failure
                  ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_1e8)
        ;
        failure<toml::error_info>::~failure(&local_1e8);
        if ((region *)CONCAT44(auStack_9c0._36_4_,auStack_9c0._32_4_) != &local_990) {
          operator_delete((region *)CONCAT44(auStack_9c0._36_4_,auStack_9c0._32_4_),
                          (long)local_990.source_.
                                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 1);
        }
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(auStack_9c0 + 8));
        if ((undefined1 *)CONCAT71(local_9d8._1_7_,local_9d8[0]) != auStack_9d0 + 8) {
          operator_delete((undefined1 *)CONCAT71(local_9d8._1_7_,local_9d8[0]),
                          (ulong)(auStack_9d0._8_8_ + 1));
        }
      }
      else {
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_Hashtable(&local_3b0,local_6b0);
        local_888 = (undefined1  [16])0x0;
        local_878 = (pointer)0x0;
        local_610._0_8_ =
             local_758.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        local_610._8_8_ =
             local_758.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if (local_758.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_758.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_758.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_758.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (local_758.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_600._M_p = local_5f0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_600,local_758.source_name_._M_dataplus._M_p,
                   local_758.source_name_._M_dataplus._M_p + local_758.source_name_._M_string_length
                  );
        local_5d8 = local_758.location_;
        sStack_5d0 = local_758.line_number_;
        local_5c8 = local_758.column_number_;
        local_5c0 = loc->location_;
        sStack_5b8 = loc->line_number_;
        local_5e0 = local_5c0 - local_758.location_;
        local_5b0 = loc->column_number_;
        fmt.name_indent = (undefined4)local_d10;
        fmt.closing_indent = local_d10._4_4_;
        fmt.fmt = (undefined1)local_d18;
        fmt.indent_type = local_d18._1_1_;
        fmt._2_2_ = local_d18._2_2_;
        fmt.body_indent = local_d18._4_4_;
        basic_value<toml::type_config>::basic_value
                  ((basic_value<toml::type_config> *)local_9d8,(table_type *)&local_3b0,fmt,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_888,(region_type *)local_610);
        region::~region((region *)local_610);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_888);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_3b0);
        ok<toml::basic_value<toml::type_config>>
                  ((success<toml::basic_value<toml::type_config>_> *)&local_2b0,(toml *)local_9d8,v)
        ;
        __return_storage_ptr__->is_ok_ = true;
        ctx_01 = &local_2b0;
        basic_value<toml::type_config>::basic_value
                  (&(__return_storage_ptr__->field_1).succ_.value,&local_2b0);
        basic_value<toml::type_config>::cleanup(&local_2b0,(EVP_PKEY_CTX *)ctx_01);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_2b0.comments_);
        region::~region(&local_2b0.region_);
        basic_value<toml::type_config>::cleanup
                  ((basic_value<toml::type_config> *)local_9d8,(EVP_PKEY_CTX *)ctx_01);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(avStack_928);
        region::~region(&local_990);
      }
    }
    else {
      region::region((region *)local_ba0,loc);
      source_location::source_location((source_location *)local_9d8,(region *)local_ba0);
      region::~region((region *)local_ba0);
      local_ab8._M_dataplus._M_p = (pointer)&local_ab8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ab8,"toml::parse_inline_table: missing closing bracket `}`","");
      p_Var1 = &local_990.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount;
      local_5a8.last_line_ = CONCAT71(auStack_9c0._9_7_,auStack_9c0[8]);
      local_5a8.file_name_._M_dataplus._M_p = (pointer)&local_5a8.file_name_.field_2;
      local_5a8.last_offset_._0_4_ = auStack_9c0._24_4_;
      local_5a8.last_offset_._4_4_ = auStack_9c0._28_4_;
      local_5a8.length_._0_4_ = auStack_9c0._32_4_;
      local_5a8.length_._4_4_ = auStack_9c0._36_4_;
      local_5a8.last_column_ = auStack_9c0._16_8_;
      local_5a8.first_column_ = auStack_9d0._8_8_;
      local_5a8.first_offset_ = auStack_9c0._0_8_;
      local_5a8.first_line_ = auStack_9d0._0_8_;
      if (local_998 == (undefined1  [8])p_Var1) {
        local_5a8.file_name_.field_2._8_8_ = local_990.source_name_._M_dataplus._M_p;
      }
      else {
        local_5a8.file_name_._M_dataplus._M_p = (pointer)local_998;
      }
      local_5a8.file_name_._M_string_length =
           (size_type)
           local_990.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_990.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_990.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._0_1_ = '\0';
      local_5a8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_990.source_name_._M_string_length;
      local_5a8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_990.source_name_.field_2._M_allocated_capacity;
      local_5a8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_990.source_name_.field_2._8_8_;
      local_990.source_name_._8_16_ = (undefined1  [16])0x0;
      local_990.source_name_.field_2._8_8_ = (pointer)0x0;
      local_ad8._M_dataplus._M_p = (pointer)&local_ad8.field_2;
      local_998 = (undefined1  [8])p_Var1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_ad8,"expected `}`, reached line end","");
      make_error_info<>((error_info *)local_ba0,&local_ab8,&local_5a8,&local_ad8);
      err<toml::error_info>(&local_190,(error_info *)local_ba0);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_190);
      failure<toml::error_info>::~failure(&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b90._40_8_ != local_b58) {
        operator_delete((void *)local_b90._40_8_,local_b58[0]._M_allocated_capacity + 1);
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_b90 + 0x10));
      if ((element_type *)local_ba0._0_8_ != (element_type *)local_b90) {
        operator_delete((void *)local_ba0._0_8_,(ulong)(local_b90._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ad8._M_dataplus._M_p != &local_ad8.field_2) {
        operator_delete(local_ad8._M_dataplus._M_p,local_ad8.field_2._M_allocated_capacity + 1);
      }
      source_location::~source_location(&local_5a8);
      local_a38.field_2._M_allocated_capacity = local_ab8.field_2._M_allocated_capacity;
      _Var24._M_p = local_ab8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ab8._M_dataplus._M_p != &local_ab8.field_2) {
LAB_0037b8a6:
        operator_delete(_Var24._M_p,local_a38.field_2._M_allocated_capacity + 1);
      }
LAB_0037b8ae:
      source_location::~source_location((source_location *)local_9d8);
    }
    if (local_ce8 == true) {
      local_ce8 = false;
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_d08 + 8));
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_6b0);
  }
  else {
    region::region((region *)local_ba0,loc);
    source_location::source_location((source_location *)local_9d8,(region *)local_ba0);
    region::~region((region *)local_ba0);
    local_9f8._M_dataplus._M_p = (pointer)&local_9f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_9f8,
               "toml::parse_inline_table: The next token is not an inline table","");
    p_Var1 = &local_990.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
    local_428.file_name_._M_dataplus._M_p = (pointer)&local_428.file_name_.field_2;
    local_428.last_offset_._0_4_ = auStack_9c0._24_4_;
    local_428.last_offset_._4_4_ = auStack_9c0._28_4_;
    local_428.length_._0_4_ = auStack_9c0._32_4_;
    local_428.length_._4_4_ = auStack_9c0._36_4_;
    local_428.last_column_ = auStack_9c0._16_8_;
    local_428.first_column_ = auStack_9d0._8_8_;
    local_428.first_offset_ = auStack_9c0._0_8_;
    local_428.first_line_ = auStack_9d0._0_8_;
    if (local_998 == (undefined1  [8])p_Var1) {
      local_428.file_name_.field_2._8_8_ = local_990.source_name_._M_dataplus._M_p;
    }
    else {
      local_428.file_name_._M_dataplus._M_p = (pointer)local_998;
    }
    local_428.file_name_._M_string_length =
         (size_type)
         local_990.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_990.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_990.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_1_ = '\0';
    local_428.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_990.source_name_._M_string_length;
    local_428.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_990.source_name_.field_2._M_allocated_capacity;
    local_428.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_990.source_name_.field_2._8_8_;
    local_990.source_name_._8_16_ = (undefined1  [16])0x0;
    local_990.source_name_.field_2._8_8_ = (pointer)0x0;
    local_a18._M_dataplus._M_p = (pointer)&local_a18.field_2;
    local_998 = (undefined1  [8])p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a18,"here","");
    make_error_info<>((error_info *)local_ba0,&local_9f8,&local_428,&local_a18);
    err<toml::error_info>(&local_88,(error_info *)local_ba0);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_88);
    failure<toml::error_info>::~failure(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b90._40_8_ != local_b58) {
      operator_delete((void *)local_b90._40_8_,local_b58[0]._M_allocated_capacity + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_b90 + 0x10));
    if ((element_type *)local_ba0._0_8_ != (element_type *)local_b90) {
      operator_delete((void *)local_ba0._0_8_,(ulong)(local_b90._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
      operator_delete(local_a18._M_dataplus._M_p,local_a18.field_2._M_allocated_capacity + 1);
    }
    source_location::~source_location(&local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9f8._M_dataplus._M_p != &local_9f8.field_2) {
      operator_delete(local_9f8._M_dataplus._M_p,local_9f8.field_2._M_allocated_capacity + 1);
    }
    source_location::~source_location((source_location *)local_9d8);
  }
  location::~location(&local_758);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_inline_table(location& loc, context<TC>& ctx)
{
    using table_type = typename basic_value<TC>::table_type;

    const auto num_errors = ctx.errors().size();

    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    if(loc.eof() || loc.current() != '{')
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_inline_table: "
            "The next token is not an inline table", std::move(src), "here"));
    }
    loc.advance();

    table_type table;
    table_format_info fmt;
    fmt.fmt = table_format::oneline;
    fmt.indent_type = indent_char::none;

    cxx::optional<multiline_spacer<TC>> spacer(cxx::make_nullopt());

    if(spec.v1_1_0_allow_newlines_in_inline_tables)
    {
        spacer = skip_multiline_spacer(loc, ctx);
        if(spacer.has_value() && spacer.value().newline_found)
        {
            fmt.fmt = table_format::multiline_oneline;
        }
    }
    else
    {
        skip_whitespace(loc, ctx);
    }

    bool still_empty = true;
    bool comma_found = false;
    while( ! loc.eof())
    {
        // closing!
        if(loc.current() == '}')
        {
            if(comma_found && ! spec.v1_1_0_allow_trailing_comma_in_inline_tables)
            {
                auto src = source_location(region(loc));
                return err(make_error_info("toml::parse_inline_table: trailing "
                    "comma is not allowed in TOML-v1.0.0)", std::move(src), "here"));
            }

            if(spec.v1_1_0_allow_newlines_in_inline_tables)
            {
                if(spacer.has_value() && spacer.value().newline_found &&
                    spacer.value().indent_type != indent_char::none)
                {
                    fmt.indent_type    = spacer.value().indent_type;
                    fmt.closing_indent = spacer.value().indent;
                }
            }
            break;
        }

        // if we already found a value and didn't found `,` nor `}`, error.
        if( ! comma_found && ! still_empty)
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_inline_table: "
                    "expected value-separator `,` or closing `}`",
                    std::move(src), "here"));
        }

        // parse indent.
        if(spacer.has_value() && spacer.value().newline_found &&
            spacer.value().indent_type != indent_char::none)
        {
            fmt.indent_type = spacer.value().indent_type;
            fmt.body_indent = spacer.value().indent;
        }

        still_empty = false; // parsing a value...
        if(auto kv_res = parse_key_value_pair<TC>(loc, ctx))
        {
            auto keys    = std::move(kv_res.unwrap().first.first);
            auto key_reg = std::move(kv_res.unwrap().first.second);
            auto val     = std::move(kv_res.unwrap().second);

            auto ins_res = insert_value(inserting_value_kind::dotted_keys,
                std::addressof(table), keys, std::move(key_reg), std::move(val));
            if(ins_res.is_err())
            {
                ctx.report_error(std::move(ins_res.unwrap_err()));
                // we need to skip until the next value (or end of the table)
                // because we don't have valid kv pair.
                while( ! loc.eof())
                {
                    const auto c = loc.current();
                    if(c == ',' || c == '\n' || c == '}')
                    {
                        comma_found = (c == ',');
                        break;
                    }
                    loc.advance();
                }
                continue;
            }

            // if comment line follows immediately(without newline) after `,`, then
            // the comment is for the elem. we need to check if comment follows `,`.
            //
            // (key) = (val) (ws|newline|comment-line)? `,` (ws)? (comment)?

            if(spec.v1_1_0_allow_newlines_in_inline_tables)
            {
                if(spacer.has_value()) // copy previous comments to value
                {
                    for(std::size_t i=0; i<spacer.value().comments.size(); ++i)
                    {
                        ins_res.unwrap()->comments().push_back(spacer.value().comments.at(i));
                    }
                }
                spacer = skip_multiline_spacer(loc, ctx);
                if(spacer.has_value())
                {
                    for(std::size_t i=0; i<spacer.value().comments.size(); ++i)
                    {
                        ins_res.unwrap()->comments().push_back(spacer.value().comments.at(i));
                    }
                    if(spacer.value().newline_found)
                    {
                        fmt.fmt = table_format::multiline_oneline;
                        if(spacer.value().indent_type != indent_char::none)
                        {
                            fmt.indent_type = spacer.value().indent_type;
                            fmt.body_indent = spacer.value().indent;
                        }
                    }
                }
            }
            else
            {
                skip_whitespace(loc, ctx);
            }

            comma_found = character(',').scan(loc).is_ok();

            if(spec.v1_1_0_allow_newlines_in_inline_tables)
            {
                auto com_res = parse_comment_line(loc, ctx);
                if(com_res.is_err())
                {
                    ctx.report_error(com_res.unwrap_err());
                }
                const bool comment_found = com_res.is_ok() && com_res.unwrap().has_value();
                if(comment_found)
                {
                    fmt.fmt = table_format::multiline_oneline;
                    ins_res.unwrap()->comments().push_back(com_res.unwrap().value());
                }
                if(comma_found)
                {
                    spacer = skip_multiline_spacer(loc, ctx, comment_found);
                    if(spacer.has_value() && spacer.value().newline_found)
                    {
                        fmt.fmt = table_format::multiline_oneline;
                    }
                }
            }
            else
            {
                skip_whitespace(loc, ctx);
            }
        }
        else
        {
            ctx.report_error(std::move(kv_res.unwrap_err()));
            while( ! loc.eof())
            {
                if(loc.current() == '}')
                {
                    break;
                }
                if( ! spec.v1_1_0_allow_newlines_in_inline_tables && loc.current() == '\n')
                {
                    break;
                }
                loc.advance();
            }
            break;
        }
    }

    if(loc.current() != '}')
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_inline_table: "
            "missing closing bracket `}`",
            std::move(src), "expected `}`, reached line end"));
    }
    else
    {
        loc.advance(); // skip }
    }

    // any error reported from this function
    if(num_errors < ctx.errors().size())
    {
        assert(ctx.has_error()); // already reported
        return err(ctx.pop_last_error());
    }

    basic_value<TC> retval(
        std::move(table), std::move(fmt), {}, region(first, loc));

    return ok(std::move(retval));
}